

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O3

void anon_unknown.dwarf_3e7fa::parseInput(Module *wasm,WasmSplitOptions *options)

{
  pointer pbVar1;
  pointer pcVar2;
  char cVar3;
  uint uVar4;
  undefined1 local_200 [392];
  size_type *local_78 [2];
  size_type local_68 [2];
  size_t *local_58 [2];
  size_t local_48 [2];
  undefined2 local_34 [2];
  IRProfile local_30;
  undefined1 local_2c;
  
  uVar4 = (wasm->features).features | (options->super_ToolOptions).enabledFeatures.features;
  (wasm->features).features = uVar4;
  (wasm->features).features = ~(options->super_ToolOptions).disabledFeatures.features & uVar4;
  local_2c = 0;
  local_34[0] = 1;
  local_30 = (options->super_ToolOptions).profile;
  pbVar1 = (options->inputFiles).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar2,pcVar2 + pbVar1->_M_string_length);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  ::wasm::ModuleReader::read(local_34,local_78,wasm,local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((options->super_ToolOptions).preserveTypeOrder == false) {
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(wasm->typeIndices)._M_h);
  }
  if ((options->super_ToolOptions).passOptions.validate != false) {
    cVar3 = ::wasm::WasmValidator::validate((Module *)local_200,(uint)wasm);
    if (cVar3 == '\0') {
      ::wasm::Fatal::Fatal((Fatal *)local_200);
      ::wasm::Fatal::operator<<((Fatal *)local_200,(char (*) [23])"error validating input");
      ::wasm::Fatal::~Fatal((Fatal *)local_200);
    }
  }
  return;
}

Assistant:

void parseInput(Module& wasm, const WasmSplitOptions& options) {
  options.applyOptionsBeforeParse(wasm);
  ModuleReader reader;
  reader.setProfile(options.profile);
  try {
    reader.read(options.inputFiles[0], wasm);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error parsing wasm";
  } catch (std::bad_alloc&) {
    Fatal() << "error building module, std::bad_alloc (possibly invalid "
               "request for silly amounts of memory)";
  }

  options.applyOptionsAfterParse(wasm);

  if (options.passOptions.validate && !WasmValidator().validate(wasm)) {
    Fatal() << "error validating input";
  }
}